

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_hdr_custom_copy(lws *wsi,char *dst,int len,char *name,int nlen)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  uint local_38;
  int n;
  ah_data_idx_t ll;
  int nlen_local;
  char *name_local;
  int len_local;
  char *dst_local;
  lws *wsi_local;
  
  if (((wsi->http).ah != (allocated_headers *)0x0) && ((*(ulong *)&wsi->field_0x46e >> 1 & 1) == 0))
  {
    *dst = '\0';
    for (local_38 = ((wsi->http).ah)->unk_ll_head; local_38 != 0;
        local_38 = lws_ser_ru32be((uint8_t *)(((wsi->http).ah)->data + (local_38 + 4)))) {
      if (((wsi->http).ah)->data_length <= local_38) {
        return -1;
      }
      uVar1 = lws_ser_ru16be((uint8_t *)(((wsi->http).ah)->data + local_38));
      if ((nlen == (uint)uVar1) &&
         (iVar2 = strncmp(name,((wsi->http).ah)->data + (local_38 + 8),(ulong)(uint)nlen),
         iVar2 == 0)) {
        uVar1 = lws_ser_ru16be((uint8_t *)(((wsi->http).ah)->data + (local_38 + 2)));
        uVar3 = (uint)uVar1;
        if ((int)(uVar3 + 1) <= len) {
          strncpy(dst,((wsi->http).ah)->data + (local_38 + 8 + nlen),(ulong)uVar3);
          dst[(int)uVar3] = '\0';
          return uVar3;
        }
        return -1;
      }
    }
  }
  return -1;
}

Assistant:

int
lws_hdr_custom_copy(struct lws *wsi, char *dst, int len, const char *name,
		    int nlen)
{
	ah_data_idx_t ll;
	int n;

	if (!wsi->http.ah || wsi->mux_substream)
		return -1;

	*dst = '\0';

	ll = wsi->http.ah->unk_ll_head;
	while (ll) {
		if (ll >= wsi->http.ah->data_length)
			return -1;
		if (nlen == lws_ser_ru16be(
			(uint8_t *)&wsi->http.ah->data[ll + UHO_NLEN]) &&
		    !strncmp(name, &wsi->http.ah->data[ll + UHO_NAME], (unsigned int)nlen)) {
			n = lws_ser_ru16be(
				(uint8_t *)&wsi->http.ah->data[ll + UHO_VLEN]);
			if (n + 1 > len)
				return -1;
			strncpy(dst, &wsi->http.ah->data[ll + UHO_NAME + (unsigned int)nlen], (unsigned int)n);
			dst[n] = '\0';

			return n;
		}
		ll = lws_ser_ru32be((uint8_t *)&wsi->http.ah->data[ll + UHO_LL]);
	}

	return -1;
}